

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O3

UChar32 ucnv_getNextUChar_63(UConverter *cnv,char **source,char *sourceLimit,UErrorCode *err)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  UConverterGetNextUChar p_Var4;
  char cVar5;
  UChar32 UVar6;
  UErrorCode UVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  UChar buffer [2];
  UConverterToUnicodeArgs args;
  UChar local_74 [2];
  int local_70;
  int local_6c;
  UConverterToUnicodeArgs local_68;
  
  if (err == (UErrorCode *)0x0) {
    return 0xffff;
  }
  if (U_ZERO_ERROR < *err) {
    return 0xffff;
  }
  if (((cnv == (UConverter *)0x0 || source == (char **)0x0) ||
      (pcVar3 = *source, sourceLimit < pcVar3)) ||
     ((ulong)((long)sourceLimit - (long)pcVar3) >> 0x1f != 0 &&
      (pcVar3 <= sourceLimit && (long)sourceLimit - (long)pcVar3 != 0))) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    return 0xffff;
  }
  cVar1 = cnv->UCharErrorBufferLength;
  iVar8 = (int)cVar1;
  if (iVar8 < 1) {
    uVar12 = 0xffffffff;
  }
  else {
    uVar12 = (uint)(ushort)cnv->UCharErrorBuffer[0];
    lVar11 = 1;
    if ((cVar1 != '\x01' && (uVar12 & 0xfc00) == 0xd800) &&
       (((ushort)cnv->UCharErrorBuffer[1] & 0xfc00) == 0xdc00)) {
      uVar12 = uVar12 * 0x400 + (uint)(ushort)cnv->UCharErrorBuffer[1] + 0xfca02400;
      lVar11 = 2;
    }
    cVar5 = cVar1 - (char)lVar11;
    cnv->UCharErrorBufferLength = cVar5;
    iVar10 = (int)lVar11;
    if (cVar5 != '\0' && (char)lVar11 <= cVar1) {
      local_70 = (int)lVar11;
      local_6c = iVar8;
      memmove(cnv->UCharErrorBuffer,cnv->UCharErrorBuffer + lVar11,(ulong)(byte)(cVar5 * '\x02'));
      iVar10 = local_70;
      iVar8 = local_6c;
    }
    if (iVar10 < iVar8) {
      return uVar12;
    }
    if ((uVar12 & 0xfffffc00) != 0xd800) {
      return uVar12;
    }
  }
  local_68.flush = '\x01';
  local_68.offsets = (int32_t *)0x0;
  local_68.target = local_74;
  local_68.targetLimit = local_74 + 1;
  local_68.size = 0x38;
  local_68.converter = cnv;
  local_68.source = pcVar3;
  local_68.sourceLimit = sourceLimit;
  if ((int)uVar12 < 0) {
    if ((cnv->toULength == '\0') &&
       (p_Var4 = cnv->sharedData->impl->getNextUChar, p_Var4 != (UConverterGetNextUChar)0x0)) {
      UVar6 = (*p_Var4)(&local_68,err);
      *source = local_68.source;
      if (*err == U_INDEX_OUTOFBOUNDS_ERROR) {
        _reset(cnv,UCNV_RESET_TO_UNICODE,'\0');
        return 0xffff;
      }
      if (-1 < UVar6 && *err < U_ILLEGAL_ARGUMENT_ERROR) {
        return UVar6;
      }
    }
    _toUnicodeWithCallback(&local_68,err);
    if (*err == U_BUFFER_OVERFLOW_ERROR) {
      *err = U_ZERO_ERROR;
      iVar8 = (int)((ulong)((long)local_68.target - (long)local_74) >> 1);
LAB_0031f021:
      if (iVar8 == 0) {
        *err = U_INDEX_OUTOFBOUNDS_ERROR;
        uVar13 = 0xffff;
        goto LAB_0031f1e5;
      }
      uVar12 = (uint)(ushort)local_74[0];
      iVar10 = iVar8;
      goto LAB_0031f02f;
    }
    iVar8 = (int)((ulong)((long)local_68.target - (long)local_74) >> 1);
    if (*err < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0031f021;
    uVar13 = 0xffff;
    uVar12 = 0;
    goto LAB_0031f18c;
  }
  local_74[0] = (UChar)uVar12;
  iVar8 = 1;
  iVar10 = 1;
  local_68.target = local_68.targetLimit;
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
LAB_0031f02f:
    iVar8 = iVar10;
    uVar13 = uVar12 & 0xffff;
    if ((uVar12 & 0xfc00) == 0xd800) {
      cVar1 = cnv->UCharErrorBufferLength;
      if (cVar1 < '\x01') {
        if (sourceLimit <= local_68.source) goto LAB_0031f186;
        local_68.targetLimit = (UChar *)&local_70;
        _toUnicodeWithCallback(&local_68,err);
        UVar7 = *err;
        uVar12 = 1;
        if (UVar7 == U_BUFFER_OVERFLOW_ERROR) {
          *err = U_ZERO_ERROR;
          UVar7 = U_ZERO_ERROR;
        }
        iVar8 = (int)((ulong)((long)local_68.target - (long)local_74) >> 1);
        if ((UVar7 < U_ILLEGAL_ARGUMENT_ERROR) && (iVar8 == 2)) {
          if (((ushort)local_74[1] & 0xfc00) == 0xdc00) {
            uVar13 = uVar13 * 0x400 + (uint)(ushort)local_74[1] + 0xfca02400;
            goto LAB_0031f1e5;
          }
          iVar8 = 2;
          goto LAB_0031f191;
        }
      }
      else {
        uVar12 = 1;
        if (((ushort)cnv->UCharErrorBuffer[0] & 0xfc00) == 0xdc00) {
          uVar13 = uVar13 * 0x400 + (uint)(ushort)cnv->UCharErrorBuffer[0] + 0xfca02400;
          cnv->UCharErrorBufferLength = cVar1 - 1U;
          if (cVar1 != '\x01') {
            memmove(cnv->UCharErrorBuffer,cnv->UCharErrorBuffer + 1,
                    (ulong)((uint)(byte)(cVar1 - 1U) * 2));
          }
        }
      }
    }
    else {
LAB_0031f186:
      uVar12 = 1;
    }
LAB_0031f18c:
    if (iVar8 <= (int)uVar12) goto LAB_0031f1e5;
  }
  else {
    uVar12 = 0;
    uVar13 = 0xffff;
  }
LAB_0031f191:
  uVar9 = iVar8 - uVar12;
  bVar2 = cnv->UCharErrorBufferLength;
  if ('\0' < (char)bVar2) {
    memmove(cnv->UCharErrorBuffer + uVar9,cnv->UCharErrorBuffer,(ulong)((uint)bVar2 * 2));
  }
  cnv->UCharErrorBufferLength = bVar2 + (char)uVar9;
  cnv->UCharErrorBuffer[0] = local_74[uVar12];
  if (1 < uVar9) {
    cnv->UCharErrorBuffer[1] = local_74[(ulong)uVar12 + 1];
  }
LAB_0031f1e5:
  *source = local_68.source;
  return uVar13;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
ucnv_getNextUChar(UConverter *cnv,
                  const char **source, const char *sourceLimit,
                  UErrorCode *err) {
    UConverterToUnicodeArgs args;
    UChar buffer[U16_MAX_LENGTH];
    const char *s;
    UChar32 c;
    int32_t i, length;

    /* check parameters */
    if(err==NULL || U_FAILURE(*err)) {
        return 0xffff;
    }

    if(cnv==NULL || source==NULL) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return 0xffff;
    }

    s=*source;
    if(sourceLimit<s) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return 0xffff;
    }

    /*
     * Make sure that the buffer sizes do not exceed the number range for
     * int32_t because some functions use the size (in units or bytes)
     * rather than comparing pointers, and because offsets are int32_t values.
     *
     * size_t is guaranteed to be unsigned and large enough for the job.
     *
     * Return with an error instead of adjusting the limits because we would
     * not be able to maintain the semantics that either the source must be
     * consumed or the target filled (unless an error occurs).
     * An adjustment would be sourceLimit=t+0x7fffffff; for example.
     */
    if(((size_t)(sourceLimit-s)>(size_t)0x7fffffff && sourceLimit>s)) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return 0xffff;
    }

    c=U_SENTINEL;

    /* flush the target overflow buffer */
    if(cnv->UCharErrorBufferLength>0) {
        UChar *overflow;

        overflow=cnv->UCharErrorBuffer;
        i=0;
        length=cnv->UCharErrorBufferLength;
        U16_NEXT(overflow, i, length, c);

        /* move the remaining overflow contents up to the beginning */
        if((cnv->UCharErrorBufferLength=(int8_t)(length-i))>0) {
            uprv_memmove(cnv->UCharErrorBuffer, cnv->UCharErrorBuffer+i,
                         cnv->UCharErrorBufferLength*U_SIZEOF_UCHAR);
        }

        if(!U16_IS_LEAD(c) || i<length) {
            return c;
        }
        /*
         * Continue if the overflow buffer contained only a lead surrogate,
         * in case the converter outputs single surrogates from complete
         * input sequences.
         */
    }

    /*
     * flush==TRUE is implied for ucnv_getNextUChar()
     *
     * do not simply return even if s==sourceLimit because the converter may
     * not have seen flush==TRUE before
     */

    /* prepare the converter arguments */
    args.converter=cnv;
    args.flush=TRUE;
    args.offsets=NULL;
    args.source=s;
    args.sourceLimit=sourceLimit;
    args.target=buffer;
    args.targetLimit=buffer+1;
    args.size=sizeof(args);

    if(c<0) {
        /*
         * call the native getNextUChar() implementation if we are
         * at a character boundary (toULength==0)
         *
         * unlike with _toUnicode(), getNextUChar() implementations must set
         * U_TRUNCATED_CHAR_FOUND for truncated input,
         * in addition to setting toULength/toUBytes[]
         */
        if(cnv->toULength==0 && cnv->sharedData->impl->getNextUChar!=NULL) {
            c=cnv->sharedData->impl->getNextUChar(&args, err);
            *source=s=args.source;
            if(*err==U_INDEX_OUTOFBOUNDS_ERROR) {
                /* reset the converter without calling the callback function */
                _reset(cnv, UCNV_RESET_TO_UNICODE, FALSE);
                return 0xffff; /* no output */
            } else if(U_SUCCESS(*err) && c>=0) {
                return c;
            /*
             * else fall through to use _toUnicode() because
             *   UCNV_GET_NEXT_UCHAR_USE_TO_U: the native function did not want to handle it after all
             *   U_FAILURE: call _toUnicode() for callback handling (do not output c)
             */
            }
        }

        /* convert to one UChar in buffer[0], or handle getNextUChar() errors */
        _toUnicodeWithCallback(&args, err);

        if(*err==U_BUFFER_OVERFLOW_ERROR) {
            *err=U_ZERO_ERROR;
        }

        i=0;
        length=(int32_t)(args.target-buffer);
    } else {
        /* write the lead surrogate from the overflow buffer */
        buffer[0]=(UChar)c;
        args.target=buffer+1;
        i=0;
        length=1;
    }

    /* buffer contents starts at i and ends before length */

    if(U_FAILURE(*err)) {
        c=0xffff; /* no output */
    } else if(length==0) {
        /* no input or only state changes */
        *err=U_INDEX_OUTOFBOUNDS_ERROR;
        /* no need to reset explicitly because _toUnicodeWithCallback() did it */
        c=0xffff; /* no output */
    } else {
        c=buffer[0];
        i=1;
        if(!U16_IS_LEAD(c)) {
            /* consume c=buffer[0], done */
        } else {
            /* got a lead surrogate, see if a trail surrogate follows */
            UChar c2;

            if(cnv->UCharErrorBufferLength>0) {
                /* got overflow output from the conversion */
                if(U16_IS_TRAIL(c2=cnv->UCharErrorBuffer[0])) {
                    /* got a trail surrogate, too */
                    c=U16_GET_SUPPLEMENTARY(c, c2);

                    /* move the remaining overflow contents up to the beginning */
                    if((--cnv->UCharErrorBufferLength)>0) {
                        uprv_memmove(cnv->UCharErrorBuffer, cnv->UCharErrorBuffer+1,
                                     cnv->UCharErrorBufferLength*U_SIZEOF_UCHAR);
                    }
                } else {
                    /* c is an unpaired lead surrogate, just return it */
                }
            } else if(args.source<sourceLimit) {
                /* convert once more, to buffer[1] */
                args.targetLimit=buffer+2;
                _toUnicodeWithCallback(&args, err);
                if(*err==U_BUFFER_OVERFLOW_ERROR) {
                    *err=U_ZERO_ERROR;
                }

                length=(int32_t)(args.target-buffer);
                if(U_SUCCESS(*err) && length==2 && U16_IS_TRAIL(c2=buffer[1])) {
                    /* got a trail surrogate, too */
                    c=U16_GET_SUPPLEMENTARY(c, c2);
                    i=2;
                }
            }
        }
    }

    /*
     * move leftover output from buffer[i..length[
     * into the beginning of the overflow buffer
     */
    if(i<length) {
        /* move further overflow back */
        int32_t delta=length-i;
        if((length=cnv->UCharErrorBufferLength)>0) {
            uprv_memmove(cnv->UCharErrorBuffer+delta, cnv->UCharErrorBuffer,
                         length*U_SIZEOF_UCHAR);
        }
        cnv->UCharErrorBufferLength=(int8_t)(length+delta);

        cnv->UCharErrorBuffer[0]=buffer[i++];
        if(delta>1) {
            cnv->UCharErrorBuffer[1]=buffer[i];
        }
    }

    *source=args.source;
    return c;
}